

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcClosedShell::~IfcClosedShell(IfcClosedShell *this)

{
  void *pvVar1;
  
  (this->super_IfcConnectedFaceSet).super_IfcTopologicalRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x8854d0;
  *(undefined8 *)&(this->super_IfcConnectedFaceSet).field_0x58 = 0x885548;
  *(undefined8 *)
   &(this->super_IfcConnectedFaceSet).super_IfcTopologicalRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x8854f8;
  *(undefined8 *)
   &(this->super_IfcConnectedFaceSet).super_IfcTopologicalRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x885520;
  pvVar1 = *(void **)&(this->super_IfcConnectedFaceSet).super_IfcTopologicalRepresentationItem.
                      field_0x30;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcConnectedFaceSet).field_0x40 - (long)pvVar1);
  }
  operator_delete(this,0x70);
  return;
}

Assistant:

IfcConnectedFaceSet() : Object("IfcConnectedFaceSet") {}